

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

int lys_set_enabled(lys_module *module)

{
  ly_ctx *plVar1;
  lys_module *node;
  int iVar2;
  LY_ERR *pLVar3;
  ly_set *mods_00;
  ly_set *set;
  uint local_44;
  uint local_40;
  uint v;
  uint u;
  int i;
  ly_set *disabled;
  ly_set *mods;
  lys_module *mod;
  ly_ctx *ctx;
  lys_module *module_local;
  
  if (module == (lys_module *)0x0) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EINVAL;
    module_local._4_4_ = 1;
  }
  else if (((byte)module->field_0x40 >> 6 & 1) == 0) {
    module_local._4_4_ = 0;
  }
  else {
    plVar1 = module->ctx;
    for (v = 0; (int)v < 5; v = v + 1) {
      if (module == (plVar1->models).list[(int)v]) {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EINVAL;
        ly_log(LY_LLERR,"Internal module \"%s\" cannot be removed.",module->name);
        return 1;
      }
    }
    mods_00 = ly_set_new();
    set = ly_set_new();
    lys_set_enabled_(mods_00,module);
LAB_001117ec:
    for (v = 5; (int)v < (plVar1->models).used; v = v + 1) {
      node = (plVar1->models).list[(int)v];
      if ((((byte)node->field_0x40 >> 6 & 1) != 0) &&
         (iVar2 = ly_set_contains(set,node), iVar2 == -1)) {
        local_40 = 0;
        while ((local_40 < node->imp_size &&
               (((byte)(node->imp[local_40].module)->field_0x40 >> 6 & 1) == 0))) {
          local_40 = local_40 + 1;
        }
        if (node->imp_size <= local_40) {
          for (local_40 = 0; local_40 < node->imp_size; local_40 = local_40 + 1) {
            for (local_44 = 0; local_44 < mods_00->number; local_44 = local_44 + 1) {
              if (node->imp[local_40].module == (lys_module *)(mods_00->set).s[local_44]) {
                node->field_0x40 = node->field_0x40 & 0xbf;
                ly_set_add(mods_00,node,0);
                goto LAB_001117ec;
              }
            }
          }
          ly_set_add(set,node,0);
        }
      }
    }
    ctx_modules_redo_backlinks(mods_00);
    for (local_44 = 0; local_44 < mods_00->number; local_44 = local_44 + 1) {
      lys_sub_module_apply_devs_augs((lys_module *)(mods_00->set).s[local_44]);
    }
    ly_set_free(mods_00);
    ly_set_free(set);
    (plVar1->models).module_set_id = (plVar1->models).module_set_id + 1;
    module_local._4_4_ = 0;
  }
  return module_local._4_4_;
}

Assistant:

API int
lys_set_enabled(const struct lys_module *module)
{
    struct ly_ctx *ctx; /* shortcut */
    struct lys_module *mod;
    struct ly_set *mods, *disabled;
    int i;
    unsigned int u, v;

    if (!module) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    } else if (!module->disabled) {
        /* already enabled module */
        return EXIT_SUCCESS;
    }
    mod = (struct lys_module *)module;
    ctx = mod->ctx;

    /* avoid disabling internal modules */
    for (i = 0; i < INTERNAL_MODULES_COUNT; i++) {
        if (mod == ctx->models.list[i]) {
            LOGERR(LY_EINVAL, "Internal module \"%s\" cannot be removed.", mod->name);
            return EXIT_FAILURE;
        }
    }

    mods = ly_set_new();
    disabled = ly_set_new();

    /* enable the module, including its dependencies */
    lys_set_enabled_(mods, mod);

    /* we will go through the all disabled modules in the context, if the module has no dependency (import)
     * that is still disabled AND at least one of its imported module is from the set we are enabling now,
     * it is going to be also enabled. This way we try to revert everething that was possibly done by
     * lys_set_disabled(). */
checkdependency:
    for (i = INTERNAL_MODULES_COUNT; i < ctx->models.used; i++) {
        mod = ctx->models.list[i]; /* shortcut */
        if (!mod->disabled || ly_set_contains(disabled, mod) != -1) {
            /* skip the enabled modules */
            continue;
        }

        /* check imported modules */
        for (u = 0; u < mod->imp_size; u++) {
            if (mod->imp[u].module->disabled) {
                /* it has disabled dependency so it must stay disabled */
                break;
            }
        }
        if (u < mod->imp_size) {
            /* it has disabled dependency, continue with the next module in the context */
            continue;
        }

        /* get know if at least one of the imported modules is being enabled this time */
        for (u = 0; u < mod->imp_size; u++) {
            for (v = 0; v < mods->number; v++) {
                if (mod->imp[u].module == mods->set.g[v]) {
                    /* yes, it is, so they are connected and we are going to enable it as well,
                     * it is not necessary to call recursive lys_set_enable_() because we already
                     * know that there is no disabled import to enable */
                    mod->disabled = 0;
                    ly_set_add(mods, mod, 0);
                    /* we have to start again because some of the already checked modules can
                     * depend on the one we have just decided to enable */
                    goto checkdependency;
                }
            }
        }

        /* this module is disabled, but it does not depend on any other disabled module and none
         * of its imports was not enabled in this call. No future enabling of the disabled module
         * will change this so we can remember the module and skip it next time we will have to go
         * through the all context because of the checkdependency goto.
         */
        ly_set_add(disabled, mod, 0);
    }

    /* maintain backlinks (start with internal ietf-yang-library which have leafs as possible targets of leafrefs */
    ctx_modules_redo_backlinks(mods);

    /* re-apply the deviations and augments */
    for (v = 0; v < mods->number; v++) {
        lys_sub_module_apply_devs_augs((struct lys_module *)mods->set.g[v]);
    }

    /* free the sets */
    ly_set_free(mods);
    ly_set_free(disabled);

    /* update the module-set-id */
    ctx->models.module_set_id++;

    return EXIT_SUCCESS;
}